

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

share_channel *
share_add_channel(ssh_sharing_connstate *cs,uint downstream_id,uint upstream_id,uint server_id,
                 int state,int maxpkt)

{
  share_channel *e;
  share_channel *psVar1;
  
  e = (share_channel *)safemalloc(1,0x38,0);
  e->downstream_id = downstream_id;
  e->upstream_id = upstream_id;
  e->server_id = server_id;
  e->state = state;
  e->downstream_maxpkt = maxpkt;
  e->x11_auth_upstream = (X11FakeAuth *)0x0;
  e->x11_auth_data = (char *)0x0;
  e->x11_auth_proto = -1;
  e->x11_auth_datalen = 0;
  e->x11_one_shot = false;
  psVar1 = (share_channel *)add234(cs->channels_by_us,e);
  if (psVar1 == e) {
    if (e->state == 3) {
      return e;
    }
    psVar1 = (share_channel *)add234(cs->channels_by_server,e);
    if (psVar1 == e) {
      return e;
    }
    del234(cs->channels_by_us,e);
  }
  safefree(e);
  return (share_channel *)0x0;
}

Assistant:

static struct share_channel *share_add_channel
    (struct ssh_sharing_connstate *cs, unsigned downstream_id,
     unsigned upstream_id, unsigned server_id, int state, int maxpkt)
{
    struct share_channel *chan = snew(struct share_channel);
    chan->downstream_id = downstream_id;
    chan->upstream_id = upstream_id;
    chan->server_id = server_id;
    chan->state = state;
    chan->downstream_maxpkt = maxpkt;
    chan->x11_auth_upstream = NULL;
    chan->x11_auth_data = NULL;
    chan->x11_auth_proto = -1;
    chan->x11_auth_datalen = 0;
    chan->x11_one_shot = false;
    if (add234(cs->channels_by_us, chan) != chan) {
        sfree(chan);
        return NULL;
    }
    if (chan->state != UNACKNOWLEDGED) {
        if (add234(cs->channels_by_server, chan) != chan) {
            del234(cs->channels_by_us, chan);
            sfree(chan);
            return NULL;
        }
    }
    return chan;
}